

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DuplicateFunctionElimination.cpp
# Opt level: O1

void __thiscall
wasm::DuplicateFunctionElimination::run(DuplicateFunctionElimination *this,Module *module)

{
  PassRunner *pPVar1;
  pointer puVar2;
  iterator __position;
  Function *left;
  Function *right;
  char *pcVar3;
  _Base_ptr p_Var4;
  undefined1 auVar5 [8];
  bool bVar6;
  mapped_type_conflict *pmVar7;
  vector<wasm::Function*,std::allocator<wasm::Function*>> *this_00;
  const_iterator cVar8;
  mapped_type *pmVar9;
  _Rb_tree_node_base *p_Var10;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar11;
  size_t sVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  undefined1 local_288 [8];
  map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  hashGroups;
  code *local_150;
  undefined8 uStack_148;
  code *local_140;
  code *pcStack_138;
  undefined1 local_130 [8];
  Map hashes;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  undefined1 local_a0 [8];
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  replacements;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> duplicates;
  long local_38;
  
  pPVar1 = (this->super_Pass).runner;
  iVar13 = (pPVar1->options).optimizeLevel;
  if ((iVar13 < 3) && ((pPVar1->options).shrinkLevel < 1)) {
    uVar14 = (ulong)((uint)(iVar13 == 2) * 9 + 1);
  }
  else {
    uVar14 = (ulong)((long)(module->functions).
                           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(module->functions).
                          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3;
  }
  while( true ) {
    iVar13 = (int)uVar14;
    uVar14 = (ulong)(iVar13 - 1);
    if (iVar13 == 0) {
      return;
    }
    FunctionHasher::createMap((Map *)local_130,module);
    hashGroups._M_t._M_impl._0_8_ = 0;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         &hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         ((ulong)hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
         0xffffffffffffff00);
    uStack_148 = 0;
    local_150 = ExpressionAnalyzer::nothingHasher;
    pcStack_138 = std::
                  _Function_handler<bool_(wasm::Expression_*,_unsigned_long_&),_bool_(*)(wasm::Expression_*,_unsigned_long_&)>
                  ::_M_invoke;
    local_140 = std::
                _Function_handler<bool_(wasm::Expression_*,_unsigned_long_&),_bool_(*)(wasm::Expression_*,_unsigned_long_&)>
                ::_M_manager;
    local_288 = (undefined1  [8])&PTR__FunctionHasher_010920e0;
    WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
           *)local_288,(this->super_Pass).runner,module);
    local_288 = (undefined1  [8])&PTR__FunctionHasher_010920e0;
    if (local_140 != (code *)0x0) {
      (*local_140)(&local_150,&local_150,3);
    }
    Pass::~Pass((Pass *)local_288);
    hashGroups._M_t._M_impl._0_8_ = hashGroups._M_t._M_impl._0_8_ & 0xffffffff00000000;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&hashGroups;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    puVar2 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    p_Var10 = hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    auVar5 = local_a0;
    for (puVar11 = (module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var10,
        puVar11 != puVar2; puVar11 = puVar11 + 1) {
      local_a0 = (undefined1  [8])
                 (puVar11->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(((Function *)local_a0)->super_Importable).module + 8) == (char *)0x0) {
        pmVar7 = std::
                 map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                 ::operator[]((map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                               *)local_130,(key_type *)local_a0);
        replacements._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = (undefined4)*pmVar7;
        this_00 = (vector<wasm::Function*,std::allocator<wasm::Function*>> *)
                  std::
                  map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                  ::operator[]((map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                *)local_288,
                               (key_type *)
                               &replacements._M_t._M_impl.super__Rb_tree_header._M_node_count);
        __position._M_current = *(Function ***)(this_00 + 8);
        if (__position._M_current == *(Function ***)(this_00 + 0x10)) {
          std::vector<wasm::Function*,std::allocator<wasm::Function*>>::
          _M_realloc_insert<wasm::Function*const&>(this_00,__position,(Function **)local_a0);
          auVar5 = local_a0;
        }
        else {
          *__position._M_current = (Function *)local_a0;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          auVar5 = local_a0;
        }
      }
      local_a0 = auVar5;
      p_Var10 = hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      auVar5 = local_a0;
    }
    replacements._M_t._M_impl._0_4_ = 0;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&replacements;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    duplicates._M_t._M_impl._0_4_ = 0;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&duplicates;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_a0 = auVar5;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    for (; p_Var4 = replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
        p_Var10 != (_Rb_tree_node_base *)&hashGroups;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      uVar15 = (ulong)((long)p_Var10[1]._M_left - (long)p_Var10[1]._M_parent) >> 3;
      iVar13 = (int)uVar15;
      if ((iVar13 != 1) && (iVar13 - 1U != 0)) {
        hashes.
        super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)(iVar13 - 1U);
        local_38 = 1;
        sVar12 = 0;
        do {
          left = *(Function **)(&(p_Var10[1]._M_parent)->_M_color + sVar12 * 2);
          cVar8 = std::
                  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                  ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                          *)&replacements._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (key_type *)left);
          duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar12 + 1;
          if ((cVar8._M_node == (_Base_ptr)&duplicates) &&
             (lVar16 = local_38,
             duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count < (uVar15 & 0xffffffff))) {
            do {
              right = *(Function **)(&(p_Var10[1]._M_parent)->_M_color + lVar16 * 2);
              cVar8 = std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                              *)&replacements._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (key_type *)right);
              if ((cVar8._M_node == (_Base_ptr)&duplicates) &&
                 (bVar6 = FunctionUtils::equal(left,right), bVar6)) {
                pmVar9 = std::
                         map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                         ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                       *)local_a0,(key_type *)right);
                pcVar3 = (left->super_Importable).super_Named.name.super_IString.str._M_str;
                (pmVar9->super_IString).str._M_len =
                     (left->super_Importable).super_Named.name.super_IString.str._M_len;
                (pmVar9->super_IString).str._M_str = pcVar3;
                std::
                _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                ::_M_insert_unique<wasm::Name_const&>
                          ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                            *)&replacements._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (Name *)right);
              }
              lVar16 = lVar16 + 1;
            } while (iVar13 != (int)lVar16);
          }
          local_38 = local_38 + 1;
          sVar12 = duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count;
        } while (duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count !=
                 hashes.
                 super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                 ._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
    }
    if (replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0) break;
    local_c8._8_8_ = 0;
    local_c8._M_unused._M_object = &replacements._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pcStack_b0 = std::
                 _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DuplicateFunctionElimination.cpp:98:11)>
                 ::_M_invoke;
    local_b8 = std::
               _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DuplicateFunctionElimination.cpp:98:11)>
               ::_M_manager;
    Module::removeFunctions(module,(function<bool_(wasm::Function_*)> *)&local_c8);
    if (local_b8 != (code *)0x0) {
      (*local_b8)(&local_c8,&local_c8,__destroy_functor);
    }
    OptUtils::replaceFunctions
              ((this->super_Pass).runner,module,
               (map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                *)local_a0);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&replacements._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                 *)local_a0);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                 *)local_288);
    std::
    _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                 *)local_130);
    if (p_Var4 == (_Base_ptr)0x0) {
      return;
    }
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&replacements._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *)local_a0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
               *)local_288);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
               *)local_130);
  return;
}

Assistant:

void run(Module* module) override {
    // Multiple iterations may be necessary: A and B may be identical only after
    // we see the functions C1 and C2 that they call are in fact identical.
    // Rarely, such "chains" can be very long, so we limit how many we do.
    auto& options = getPassOptions();
    Index limit;
    if (options.optimizeLevel >= 3 || options.shrinkLevel >= 1) {
      limit = module->functions.size(); // no limit
    } else if (options.optimizeLevel >= 2) {
      // 10 passes usually does most of the work, as this is typically
      // logarithmic
      limit = 10;
    } else {
      limit = 1;
    }
    while (limit > 0) {
      limit--;
      // Hash all the functions
      auto hashes = FunctionHasher::createMap(module);
      FunctionHasher(&hashes).run(getPassRunner(), module);
      // Find hash-equal groups
      std::map<uint32_t, std::vector<Function*>> hashGroups;
      ModuleUtils::iterDefinedFunctions(*module, [&](Function* func) {
        hashGroups[hashes[func]].push_back(func);
      });
      // Find actually equal functions and prepare to replace them
      std::map<Name, Name> replacements;
      std::set<Name> duplicates;
      for (auto& [_, group] : hashGroups) {
        Index size = group.size();
        if (size == 1) {
          continue;
        }
        // The groups should be fairly small, and even if a group is large we
        // should have almost all of them identical, so we should not hit actual
        // O(N^2) here unless the hash is quite poor.
        for (Index i = 0; i < size - 1; i++) {
          auto* first = group[i];
          if (duplicates.count(first->name)) {
            continue;
          }
          for (Index j = i + 1; j < size; j++) {
            auto* second = group[j];
            if (duplicates.count(second->name)) {
              continue;
            }
            if (FunctionUtils::equal(first, second)) {
              // great, we can replace the second with the first!
              replacements[second->name] = first->name;
              duplicates.insert(second->name);
            }
          }
        }
      }
      // perform replacements
      if (replacements.size() > 0) {
        // remove the duplicates
        module->removeFunctions(
          [&](Function* func) { return duplicates.count(func->name) > 0; });
        OptUtils::replaceFunctions(getPassRunner(), *module, replacements);
      } else {
        break;
      }
    }
  }